

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O1

void middleOut(bool precompression,ifstream *sourceFile,ofstream *compressedFile)

{
  size_t __n;
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  string *this;
  Word *pWVar7;
  bool bVar8;
  bool bVar9;
  string currentWord;
  Word newWord;
  char *local_280;
  size_t local_278;
  char local_270;
  undefined7 uStack_26f;
  istream *local_260;
  string local_258;
  Word local_238 [13];
  
  if (((byte)sourceFile[*(long *)(*(long *)sourceFile + -0x18) + 0x20] & 5) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"File not found... maybe use pipey");
    std::endl<char,std::char_traits<char>>(poVar2);
LAB_00103cf7:
    exit(0);
  }
  if (precompression) {
    local_280 = &local_270;
    local_278 = 0;
    local_270 = '\0';
    if (((byte)sourceFile[*(long *)(*(long *)sourceFile + -0x18) + 0x20] & 2) == 0) {
      local_260 = (istream *)sourceFile;
      do {
        std::operator>>((istream *)sourceFile,(string *)&local_280);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_280,local_278);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        if (wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.super__Vector_impl_data
            ._M_finish ==
            wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.super__Vector_impl_data
            ._M_start) {
LAB_001038e3:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Adding word",0xb);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
          std::ostream::put(' ');
          std::ostream::flush();
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_258,local_280,local_280 + local_278);
          Word::Word(local_238,&local_258,1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          std::vector<Word,_std::allocator<Word>_>::push_back(&wordList,local_238);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238[0]._word._M_dataplus._M_p != &local_238[0]._word.field_2) {
            operator_delete(local_238[0]._word._M_dataplus._M_p,
                            local_238[0]._word.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          lVar4 = 0;
          uVar5 = 0;
          bVar8 = false;
          do {
            Word::getWord_abi_cxx11_
                      (&local_238[0]._word,
                       (Word *)((long)&((wordList.super__Vector_base<Word,_std::allocator<Word>_>.
                                         _M_impl.super__Vector_impl_data._M_start)->_word).
                                       _M_dataplus._M_p + lVar4));
            if (local_278 == local_238[0]._word._M_string_length) {
              if (local_278 == 0) {
                bVar9 = true;
              }
              else {
                iVar1 = bcmp(local_280,local_238[0]._word._M_dataplus._M_p,local_278);
                bVar9 = iVar1 == 0;
              }
            }
            else {
              bVar9 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238[0]._word._M_dataplus._M_p != &local_238[0]._word.field_2) {
              operator_delete(local_238[0]._word._M_dataplus._M_p,
                              local_238[0]._word.field_2._M_allocated_capacity + 1);
            }
            if (bVar9) {
              pWVar7 = (Word *)((long)&((wordList.super__Vector_base<Word,_std::allocator<Word>_>.
                                         _M_impl.super__Vector_impl_data._M_start)->_word).
                                       _M_dataplus._M_p + lVar4);
              iVar1 = Word::getFrequency(pWVar7);
              bVar8 = true;
              Word::setFrequency(pWVar7,iVar1 + 1);
            }
            uVar5 = uVar5 + 1;
            uVar3 = ((long)wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
            lVar4 = lVar4 + 0x28;
          } while (uVar5 <= uVar3 && uVar3 - uVar5 != 0);
          sourceFile = (ifstream *)local_260;
          if (!bVar8) goto LAB_001038e3;
        }
      } while (((byte)((istream *)sourceFile)[*(long *)(*(long *)sourceFile + -0x18) + 0x20] & 2) ==
               0);
    }
    if ((long)wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
              super__Vector_impl_data._M_start != 0x28) {
      lVar4 = 0;
      uVar5 = 0;
      do {
        iVar1 = Word::getFrequency((Word *)((long)&((wordList.
                                                  super__Vector_base<Word,_std::allocator<Word>_>.
                                                  _M_impl.super__Vector_impl_data._M_start)->_word).
                                                  _M_dataplus._M_p + lVar4));
        pWVar7 = (Word *)((long)&((wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                                   super__Vector_impl_data._M_start)->_word)._M_dataplus._M_p +
                         lVar4);
        if (maxCount < iVar1) {
          maxCount = Word::getFrequency(pWVar7);
          Word::getWord_abi_cxx11_
                    (&local_238[0]._word,
                     (Word *)((long)&((wordList.super__Vector_base<Word,_std::allocator<Word>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->_word)._M_dataplus
                                     ._M_p + lVar4));
          this = &maxWord_abi_cxx11_;
LAB_00103ace:
          std::__cxx11::string::operator=((string *)this,(string *)local_238);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238[0]._word._M_dataplus._M_p != &local_238[0]._word.field_2) {
            operator_delete(local_238[0]._word._M_dataplus._M_p,
                            local_238[0]._word.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          iVar1 = Word::getFrequency(pWVar7);
          pWVar7 = (Word *)((long)&((wordList.super__Vector_base<Word,_std::allocator<Word>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->_word)._M_dataplus.
                                   _M_p + lVar4);
          if (secondMaxCount < iVar1) {
            secondMaxCount = Word::getFrequency(pWVar7);
            Word::getWord_abi_cxx11_
                      (&local_238[0]._word,
                       (Word *)((long)&((wordList.super__Vector_base<Word,_std::allocator<Word>_>.
                                         _M_impl.super__Vector_impl_data._M_start)->_word).
                                       _M_dataplus._M_p + lVar4));
            this = &secondMaxWord_abi_cxx11_;
            goto LAB_00103ace;
          }
          iVar1 = Word::getFrequency(pWVar7);
          if (thirdMaxCount < iVar1) {
            thirdMaxCount =
                 Word::getFrequency((Word *)((long)&((wordList.
                                                  super__Vector_base<Word,_std::allocator<Word>_>.
                                                  _M_impl.super__Vector_impl_data._M_start)->_word).
                                                  _M_dataplus._M_p + lVar4));
            Word::getWord_abi_cxx11_
                      (&local_238[0]._word,
                       (Word *)((long)&((wordList.super__Vector_base<Word,_std::allocator<Word>_>.
                                         _M_impl.super__Vector_impl_data._M_start)->_word).
                                       _M_dataplus._M_p + lVar4));
            this = &thirdMaxWord_abi_cxx11_;
            goto LAB_00103ace;
          }
        }
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x28;
      } while (uVar5 < ((long)wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 - 1U);
    }
  }
  else {
    local_280 = &local_270;
    local_278 = 0;
    local_270 = '\0';
    std::ifstream::ifstream(local_238,"test.txt",_S_in);
    if ((*(byte *)((long)&local_238[0]._frequency +
                  *(long *)(local_238[0]._word._M_dataplus._M_p + -0x18)) & 5) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"File not found... maybe use pipey",0x21);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      goto LAB_00103cf7;
    }
    if ((*(byte *)((long)&local_238[0]._frequency +
                  *(long *)(local_238[0]._word._M_dataplus._M_p + -0x18)) & 2) == 0) {
      do {
        std::operator>>((istream *)local_238,(string *)&local_280);
        iVar1 = std::istream::peek();
        if (iVar1 == 10) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)compressedFile,"\n",1);
        }
        __n = local_278;
        if (local_278 == maxWord_abi_cxx11_._M_string_length) {
          pcVar6 = " 1";
          if (local_278 != 0) {
            iVar1 = bcmp(local_280,maxWord_abi_cxx11_._M_dataplus._M_p,local_278);
            pcVar6 = " 1";
            if (iVar1 != 0) goto LAB_00103bf1;
          }
LAB_00103c83:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)compressedFile,pcVar6,2);
        }
        else {
LAB_00103bf1:
          if (__n == secondMaxWord_abi_cxx11_._M_string_length) {
            pcVar6 = " 2";
            if (__n != 0) {
              iVar1 = bcmp(local_280,secondMaxWord_abi_cxx11_._M_dataplus._M_p,__n);
              pcVar6 = " 2";
              if (iVar1 != 0) goto LAB_00103c20;
            }
            goto LAB_00103c83;
          }
LAB_00103c20:
          if (__n == thirdMaxWord_abi_cxx11_._M_string_length) {
            pcVar6 = " 3";
            if (__n != 0) {
              iVar1 = bcmp(local_280,thirdMaxWord_abi_cxx11_._M_dataplus._M_p,__n);
              pcVar6 = " 3";
              if (iVar1 != 0) goto LAB_00103c5b;
            }
            goto LAB_00103c83;
          }
LAB_00103c5b:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)compressedFile," ",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)compressedFile,local_280,local_278);
        }
      } while ((*(byte *)((long)&local_238[0]._frequency +
                         *(long *)(local_238[0]._word._M_dataplus._M_p + -0x18)) & 2) == 0);
    }
    std::ifstream::~ifstream(local_238);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280,CONCAT71(uStack_26f,local_270) + 1);
  }
  return;
}

Assistant:

void middleOut(bool precompression,  ifstream &sourceFile, ofstream &compressedFile)
{

    // Ensure the source file is opened properly again
    if(sourceFile.fail())
    {
        cerr << "File not found... maybe use pipey"<< endl;
        exit(0);

    }

    // If just parsing logic is different than compressing
    if (precompression)
    {
        // Read each word in one at a time until at end of file
        string currentWord;

        while (!sourceFile.eof())
        {
            // Boolean for tracking if a word is in list already or not
            bool wordMatch = false;
            // Read current word
            sourceFile >> currentWord;
            // Debugging
            cout << currentWord << endl;

            // Loop through every word in the list of seen words and check if current word is a match
            for (int i = 0; i < wordList.size(); i++)
            {
                // If it matches word in list already set match flag to true and add plus one to frequency count of that
                // specific word frequency

                if (currentWord == wordList[i].getWord())
                {
                    wordMatch = true;
                    wordList[i].setFrequency((wordList[i].getFrequency()) + 1);
                }
            }

            // If matching flag was never set indicating non of the words in the vector are the current word than
            // save a new Word object using the current word as paramater for construction
            if (!wordMatch)
            {
                cout << "Adding word" << endl;
                // New word object with current word name and 1 as starting frequency
                Word newWord(currentWord, 1);

                // Add to back of word vector
                wordList.push_back(newWord);
                //Debugging
                cout << wordList.size() << endl;

            }

        }

        // For all words in the saved wordlist get top three most frequent ones and save to global variables
        for (int i = 0; i < wordList.size()-1; i++)
        {
            // Max word biggest bang for your buck
            if (wordList[i].getFrequency() > maxCount)
            {
                maxCount = wordList[i].getFrequency();
                maxWord = wordList[i].getWord();
            }

            // Second most common
            else if (wordList[i].getFrequency()> secondMaxCount)
            {
                // Store seccond most common
                secondMaxCount = wordList[i].getFrequency();
                secondMaxWord = wordList[i].getWord();

            }
            // Third most common
            else if (wordList[i].getFrequency() > thirdMaxCount)
            {
                thirdMaxCount  = wordList[i].getFrequency();
                thirdMaxWord = wordList[i].getWord();

            }
        }
    }

    // If not precompressing actually compress
    else
    {
        // Compress the file actually

        string currentWord;

        // Reload file and ensure it opens properly
        ifstream loadFile("test.txt");
        if (loadFile.fail())
        {
            cerr << "File not found... maybe use pipey"<< endl;
            exit(0);
        }

        // Read every word in source one at a time and replace if matches top 3
        while (!loadFile.eof())
        {

            loadFile >> currentWord;
            // Check current char to determin when to save a new line in compressed.pra
            if (loadFile.peek() == '\n')
            {
                compressedFile << "\n";
            }

            // Check for top 3 matching words if found replace with mapping byte
            if (currentWord == maxWord)
            {
                compressedFile << " 1";

            }
            else if (currentWord == secondMaxWord)
            {
                compressedFile << " 2";
            }
            else if (currentWord == thirdMaxWord)
            {
                compressedFile << " 3";
            }

            // If the word doesnt match the top 3 simple save it as is to the compressed.pra file
            else
            {
                compressedFile << " " << currentWord;
            }
        }
    }


}